

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsTextItem::focusInEvent(QGraphicsTextItem *this,QFocusEvent *event)

{
  QWidgetTextControl *this_00;
  int iVar1;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  QRectF local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetTextControl *)**(undefined8 **)(this + 0x20);
  if (this_00 != (QWidgetTextControl *)0x0) {
    iVar1 = *(int *)(*(undefined8 **)(this + 0x20) + 5);
    QWidgetTextControl::document(this_00);
    QTextDocument::pageSize();
    local_48.yp = in_XMM1_Qa * (double)iVar1;
    local_48.xp = 0.0;
    QWidgetTextControl::processEvent(this_00,(QEvent *)event,(QPointF *)&local_48,(QWidget *)0x0);
  }
  iVar1 = QFocusEvent::reason();
  if (iVar1 == 0) {
    *(byte *)(*(long *)(this + 0x20) + 0x2e) = *(byte *)(*(long *)(this + 0x20) + 0x2e) | 1;
  }
  local_48.w = 0.0;
  local_48.h = 0.0;
  local_48.xp = 0.0;
  local_48.yp = 0.0;
  QGraphicsItem::update((QGraphicsItem *)(this + 0x10),&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::focusInEvent(QFocusEvent *event)
{
    dd->sendControlEvent(event);
    if (event->reason() == Qt::MouseFocusReason) {
        dd->clickCausedFocus = 1;
    }
    update();
}